

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.cpp
# Opt level: O1

void util::from_utf8(string *from,string *to,codepage_id codepage)

{
  ulong uVar1;
  char *pcVar2;
  ostringstream *this;
  long lVar3;
  size_type sVar4;
  ulong uVar5;
  bool bVar6;
  uint uVar7;
  char *pcVar8;
  ulong uVar9;
  byte *pbVar10;
  byte *pbVar11;
  long lVar12;
  logger local_1b0;
  
  sVar4 = from->_M_string_length;
  if (sVar4 == 0) {
    to->_M_string_length = 0;
    *(to->_M_dataplus)._M_p = '\0';
  }
  else {
    if (codepage == 0xfde9) {
LAB_00152649:
      std::__cxx11::string::_M_assign((string *)to);
      return;
    }
    bVar6 = anon_unknown_0::is_extended_ascii(codepage);
    if (bVar6) {
      pcVar8 = (from->_M_dataplus)._M_p;
      pcVar2 = pcVar8 + sVar4;
      bVar6 = true;
      do {
        lVar3 = 0;
        do {
          lVar12 = lVar3;
          if (lVar12 != 0) break;
          lVar3 = 1;
        } while (-1 < *pcVar8);
        if (lVar12 == 0) break;
        pcVar8 = pcVar8 + lVar12;
        bVar6 = pcVar8 != pcVar2;
      } while (bVar6);
      if (!bVar6) goto LAB_00152649;
    }
    if (codepage == 0x4e4) {
      to->_M_string_length = 0;
      *(to->_M_dataplus)._M_p = '\0';
      std::__cxx11::string::reserve((ulong)to);
      if (from->_M_string_length != 0) {
        bVar6 = false;
        pbVar10 = (byte *)(from->_M_dataplus)._M_p;
        do {
          pbVar11 = pbVar10 + 1;
          if ((char)*pbVar10 < '\0') {
            uVar7 = 0x5f;
          }
          else {
            uVar7 = (uint)*pbVar10;
          }
          if ((0xff < uVar7 || (uVar7 & 0xe0) == 0x80) && (uVar7 != 0x20ac)) {
            uVar9 = 0;
            do {
              if (uVar9 == 0x1f) {
                bVar6 = true;
                break;
              }
              uVar5 = uVar9 & 0x3f;
              uVar1 = uVar9 + 1;
              lVar3 = uVar9 * 4;
              uVar9 = uVar1;
            } while ((uVar7 != *(uint *)((anonymous_namespace)::windows1252_replacements + lVar3 + 4
                                        )) || ((0x1000d001UL >> uVar5 & 1) != 0));
          }
          std::__cxx11::string::push_back((char)to);
          pbVar10 = pbVar11;
        } while (pbVar11 != (byte *)((from->_M_dataplus)._M_p + from->_M_string_length));
        if (bVar6) {
          local_1b0.level = Warning;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.buffer);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0.buffer,
                     "Unsupported character while converting from UTF-8 to Windows-1252.",0x42);
          logger::~logger(&local_1b0);
        }
      }
    }
    else {
      if (codepage == 0x4b0) {
        pcVar2 = (from->_M_dataplus)._M_p;
        wtf8_to_utf16le(pcVar2,pcVar2 + sVar4,to);
        return;
      }
      bVar6 = anon_unknown_0::utf8_iconv(from,to,codepage,true);
      if (!bVar6) {
        this = &local_1b0.buffer;
        local_1b0.level = Warning;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this,"Unsupported output codepage: ",0x1d);
        std::ostream::_M_insert<unsigned_long>((ulong)this);
        logger::~logger(&local_1b0);
        std::__cxx11::string::_M_assign((string *)to);
      }
    }
  }
  return;
}

Assistant:

void from_utf8(const std::string & from, std::string & to, codepage_id codepage) {
	
	if(from.empty()) {
		to.clear();
		return;
	}
	
	if(codepage == cp_utf8 || (is_extended_ascii(codepage) && is_ascii(from))) {
		to = from;
		return;
	}
	
	switch(codepage) {
		case cp_utf16le:     wtf8_to_utf16le(from, to); return;
		case cp_windows1252: utf8_to_windows1252(from, to); return;
		default: break;
	}
	
	#if INNOEXTRACT_HAVE_ICONV
	if(from_utf8_iconv(from, to, codepage)) {
		return;
	}
	#endif
	
	#if INNOEXTRACT_HAVE_WIN32_CONV
	if(from_utf8_win32(from, to, codepage)) {
		return;
	}
	#endif
	
	log_warning << "Unsupported output codepage: " << codepage;
	to = from;
	
}